

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O2

Vector3 * __thiscall Vector3::getAnVerticalVector(Vector3 *__return_storage_ptr__,Vector3 *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  Vector3 local_28;
  
  dVar1 = this->x;
  dVar2 = this->y;
  dVar4 = this->z;
  if (ABS(SQRT(dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2) + -1.0) <= 1e-05) {
    dVar4 = dVar4 + dVar1 * 0.0 + dVar2 * 0.0;
    __return_storage_ptr__->x = dVar4;
    __return_storage_ptr__->y = dVar4;
    __return_storage_ptr__->z = dVar4;
    local_28.x = 0.0;
    local_28.y = 0.0;
    local_28.z = 0.0;
    bVar3 = operator==(__return_storage_ptr__,&local_28);
    if (bVar3) {
      __return_storage_ptr__->x = 1.0;
      __return_storage_ptr__->y = 0.0;
      __return_storage_ptr__->z = 0.0;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!sign(len() - 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Vector3.cpp"
                ,0xca,"Vector3 Vector3::getAnVerticalVector() const");
}

Assistant:

double Vector3::len() const{
    return std::sqrt( x * x + y * y + z * z );
}